

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

uint __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseHex4<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,size_t escapeOffset
          )

{
  MemoryStream *pMVar1;
  int iVar2;
  Ch *pCVar3;
  int iVar4;
  Ch CVar5;
  uint uVar6;
  bool bVar7;
  
  pMVar1 = is->is_;
  pCVar3 = pMVar1->src_;
  uVar6 = 0;
  iVar4 = 4;
  while( true ) {
    bVar7 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar7) {
      return uVar6;
    }
    if (pCVar3 == pMVar1->end_) {
      CVar5 = '\0';
    }
    else {
      CVar5 = *pCVar3;
    }
    iVar2 = -0x30;
    if (((9 < (byte)(CVar5 - 0x30U)) && (iVar2 = -0x37, 5 < (byte)(CVar5 + 0xbfU))) &&
       (iVar2 = -0x57, 5 < (byte)(CVar5 + 0x9fU))) break;
    if (pCVar3 != pMVar1->end_) {
      pCVar3 = pCVar3 + 1;
      pMVar1->src_ = pCVar3;
    }
    uVar6 = (int)CVar5 + uVar6 * 0x10 + iVar2;
  }
  if (*(int *)(this + 0x30) == 0) {
    *(undefined4 *)(this + 0x30) = 8;
    *(size_t *)(this + 0x38) = escapeOffset;
    return 0;
  }
  __assert_fail("!HasParseError()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/rapidjson/reader.h"
                ,0x395,
                "unsigned int rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseHex4(InputStream &, size_t) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>]"
               );
}

Assistant:

unsigned ParseHex4(InputStream& is, size_t escapeOffset) {
        unsigned codepoint = 0;
        for (int i = 0; i < 4; i++) {
            Ch c = is.Peek();
            codepoint <<= 4;
            codepoint += static_cast<unsigned>(c);
            if (c >= '0' && c <= '9')
                codepoint -= '0';
            else if (c >= 'A' && c <= 'F')
                codepoint -= 'A' - 10;
            else if (c >= 'a' && c <= 'f')
                codepoint -= 'a' - 10;
            else {
                RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorStringUnicodeEscapeInvalidHex, escapeOffset);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(0);
            }
            is.Take();
        }
        return codepoint;
    }